

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Periodicity.cpp
# Opt level: O3

vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> * __thiscall
amrex::Periodicity::shiftIntVect
          (vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__return_storage_ptr__,
          Periodicity *this)

{
  pointer *ppIVar1;
  int iVar2;
  iterator __position;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int i;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int jmp [3];
  int per [3];
  int local_68 [4];
  undefined8 local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  IntVect local_3c;
  
  lVar7 = 0;
  (__return_storage_ptr__->super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = 0;
  local_50 = 0;
  local_68[0] = 1;
  local_68[1] = 1;
  local_68[2] = 1;
  do {
    iVar2 = (this->period).vect[lVar7];
    if (0 < iVar2) {
      local_68[lVar7] = iVar2;
      *(int *)((long)&local_58 + lVar7 * 4) = iVar2;
    }
    iVar6 = local_50;
    lVar4 = local_58;
    iVar2 = local_68[2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  iVar3 = (int)local_58;
  if (-1 < (int)local_58) {
    iVar10 = -(int)local_58;
    iVar5 = local_58._4_4_;
    local_48 = -local_58._4_4_;
    local_40 = -local_50;
    local_4c = local_68[0];
    local_44 = local_68[1];
    do {
      iVar8 = local_48;
      if (-1 < lVar4) {
        do {
          iVar9 = local_40;
          if (-1 < iVar6) {
            do {
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_3c.vect[0] = iVar10;
                local_3c.vect[1] = iVar8;
                local_3c.vect[2] = iVar9;
                std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
                _M_realloc_insert<amrex::IntVect>(__return_storage_ptr__,__position,&local_3c);
              }
              else {
                (__position._M_current)->vect[2] = iVar9;
                *(ulong *)(__position._M_current)->vect = CONCAT44(iVar8,iVar10);
                ppIVar1 = &(__return_storage_ptr__->
                           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppIVar1 = *ppIVar1 + 1;
              }
              iVar9 = iVar9 + iVar2;
            } while (iVar9 <= iVar6);
          }
          iVar8 = iVar8 + local_44;
        } while (iVar8 <= iVar5);
      }
      iVar10 = iVar10 + local_4c;
    } while (iVar10 <= iVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IntVect>
Periodicity::shiftIntVect () const
{
    std::vector<IntVect> r;

    int per[3] = {0,0,0};
    int jmp[3] = {1,1,1};

    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (isPeriodic(i)) {
            per[i] = jmp[i] = period[i];
        }
    }

    for (int i = -per[0]; i <= per[0]; i += jmp[0]) {
    for (int j = -per[1]; j <= per[1]; j += jmp[1]) {
    for (int k = -per[2]; k <= per[2]; k += jmp[2]) {
        r.push_back(IntVect(AMREX_D_DECL(i,j,k)));
    }
    }
    }

    return r;
}